

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::test_LockDirectory::test_method(test_LockDirectory *this)

{
  bool bVar1;
  undefined1 uVar2;
  __sighandler_t __handler;
  lazy_ostream *plVar3;
  long in_FS_OFFSET;
  _func_void_int *old_handler;
  int processstatus;
  thread thr;
  LockResult threadresult;
  char ch;
  pid_t pid;
  int fd [2];
  path lockname;
  path dirname;
  char *in_stack_fffffffffffff128;
  __native_type *in_stack_fffffffffffff130;
  char *in_stack_fffffffffffff138;
  path *in_stack_fffffffffffff140;
  lazy_ostream *in_stack_fffffffffffff150;
  int fd_00;
  type *in_stack_fffffffffffff158;
  path *ppVar4;
  undefined4 in_stack_fffffffffffff160;
  LockResult in_stack_fffffffffffff164;
  lazy_ostream *in_stack_fffffffffffff168;
  undefined8 in_stack_fffffffffffff198;
  path *in_stack_fffffffffffff1a0;
  undefined7 in_stack_fffffffffffff1a8;
  undefined1 in_stack_fffffffffffff1af;
  undefined1 local_b60 [88];
  undefined1 local_b08 [92];
  __native_type local_aac [2];
  __pid_t local_a54;
  undefined1 local_a50 [16];
  undefined1 local_a40 [68];
  __native_type local_9fc [2];
  __native_type local_99c [2];
  int local_93c;
  undefined1 local_938 [95];
  __native_type local_8d9 [2];
  __native_type local_884 [2];
  __native_type local_824 [2];
  undefined1 local_7c8 [95];
  __native_type local_769 [2];
  __native_type local_714 [2];
  __native_type local_6b4 [2];
  __native_type local_658 [2];
  __native_type local_5f9 [2];
  __native_type local_5a4 [2];
  __native_type local_544 [2];
  __native_type local_4e4 [2];
  undefined1 *local_490;
  path *local_488;
  undefined1 *local_480;
  undefined1 local_46c [4];
  undefined1 local_468 [88];
  undefined1 local_410 [88];
  undefined1 local_3b8 [88];
  undefined1 local_360 [95];
  __native_type local_301 [2];
  __native_type local_2ac [2];
  __native_type local_24c [2];
  undefined1 local_1e9;
  undefined1 local_1e8 [88];
  undefined1 local_190 [92];
  undefined1 local_134 [8];
  undefined1 local_12c [4];
  undefined1 local_128 [16];
  undefined1 local_118 [144];
  int local_88;
  int local_84;
  undefined1 local_80 [80];
  path local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((ArgsManager *)&in_stack_fffffffffffff130->__data);
  fs::operator/(in_stack_fffffffffffff140,in_stack_fffffffffffff138);
  fs::path::~path((path *)in_stack_fffffffffffff128);
  fs::path::path((path *)0xc6b307,in_stack_fffffffffffff128);
  __handler = ::signal(0x11,(__sighandler_t)0x0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
               in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff168,
               (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
               (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
               (char (*) [1])in_stack_fffffffffffff128);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
               in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
    local_12c = (undefined1  [4])socketpair(1,1,0,&local_88);
    local_134._4_4_ = 0;
    in_stack_fffffffffffff138 = "0";
    in_stack_fffffffffffff130 = (__native_type *)(local_134 + 4);
    in_stack_fffffffffffff128 = "socketpair(1, SOCK_STREAM, 0, fd)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_118,local_128,0x49f,1,2,local_12c);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff128);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_134._0_4_ = fork();
  if (local_134._0_4_ == 0) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_190._4_4_ = close(local_84);
      local_190._0_4_ = 0;
      in_stack_fffffffffffff138 = "0";
      in_stack_fffffffffffff130 = (__native_type *)local_190;
      in_stack_fffffffffffff128 = "close(fd[1])";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
                (&(((__native_type *)local_190)->__data).__list,
                 &(((__native_type *)local_190)->__data).__owner,0x4a2,1,2,
                 &(((__native_type *)local_190)->__data).__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    fs::path::path((path *)in_stack_fffffffffffff128,(path *)0xc6b5f7);
    fd_00 = (int)((ulong)in_stack_fffffffffffff150 >> 0x20);
    fs::path::path((path *)in_stack_fffffffffffff128,(path *)0xc6b60e);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      TestOtherProcess((path *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                       (path *)in_stack_fffffffffffff158,fd_00);
    }
  }
  else {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_1e8._4_4_ = close(local_88);
      local_1e8._0_4_ = 0;
      in_stack_fffffffffffff138 = "0";
      in_stack_fffffffffffff130 = (__native_type *)local_1e8;
      in_stack_fffffffffffff128 = "close(fd[0])";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
                (&(((__native_type *)local_1e8)->__data).__list,
                 &(((__native_type *)local_1e8)->__data).__owner,0x4a5,1,2,
                 &(((__native_type *)local_1e8)->__data).__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_24c[0]._4_8_ = ::write(local_84,&LockCommand,1);
      local_24c[0].__data.__lock = 1;
      in_stack_fffffffffffff138 = "1";
      in_stack_fffffffffffff130 = local_24c;
      in_stack_fffffffffffff128 = "write(fd[1], &LockCommand, 1)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                ((undefined1 *)((long)&local_24c[0].__data.__list.__prev + 4),
                 &local_24c[0].__data.__nusers,0x4a9,1,2,&local_24c[0].__data.__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_2ac[0]._4_8_ = ::read(local_84,&local_1e9,1);
      local_2ac[0].__data.__lock = 1;
      in_stack_fffffffffffff138 = "1";
      in_stack_fffffffffffff130 = local_2ac;
      in_stack_fffffffffffff128 = "read(fd[1], &ch, 1)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                ((undefined1 *)((long)&local_2ac[0].__data.__list.__prev + 4),
                 &local_2ac[0].__data.__nusers,0x4aa,1,2,&local_2ac[0].__data.__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_301[0].__size[0] = '\x03';
      in_stack_fffffffffffff138 = "ResErrorWrite";
      in_stack_fffffffffffff130 = local_301;
      in_stack_fffffffffffff128 = "ch";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,util_tests::__2>
                ((undefined1 *)((long)&local_301[0].__data.__kind + 1),
                 (undefined1 *)((long)&local_301[0].__data.__lock + 1),0x4ab,1,2,&local_1e9);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_360._4_4_ =
           util::LockDirectory((path *)CONCAT17(in_stack_fffffffffffff1af,in_stack_fffffffffffff1a8)
                               ,in_stack_fffffffffffff1a0,
                               SUB81((ulong)in_stack_fffffffffffff198 >> 0x38,0));
      local_360._0_4_ = 1;
      in_stack_fffffffffffff138 = "util::LockResult::ErrorWrite";
      in_stack_fffffffffffff130 = (__native_type *)local_360;
      in_stack_fffffffffffff128 = "util::LockDirectory(dirname, lockname)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
                (&(((__native_type *)local_360)->__data).__list,
                 &(((__native_type *)local_360)->__data).__owner,0x4ae,1,2,
                 &(((__native_type *)local_360)->__data).__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    fs::create_directories((path *)&in_stack_fffffffffffff130->__data);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_3b8._4_4_ =
           util::LockDirectory((path *)CONCAT17(in_stack_fffffffffffff1af,in_stack_fffffffffffff1a8)
                               ,in_stack_fffffffffffff1a0,
                               SUB81((ulong)in_stack_fffffffffffff198 >> 0x38,0));
      local_3b8._0_4_ = 0;
      in_stack_fffffffffffff138 = "util::LockResult::Success";
      in_stack_fffffffffffff130 = (__native_type *)local_3b8;
      in_stack_fffffffffffff128 = "util::LockDirectory(dirname, lockname, true)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
                (&(((__native_type *)local_3b8)->__data).__list,
                 &(((__native_type *)local_3b8)->__data).__owner,0x4b3,1,2,
                 &(((__native_type *)local_3b8)->__data).__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_410._4_4_ =
           util::LockDirectory((path *)CONCAT17(in_stack_fffffffffffff1af,in_stack_fffffffffffff1a8)
                               ,in_stack_fffffffffffff1a0,
                               SUB81((ulong)in_stack_fffffffffffff198 >> 0x38,0));
      local_410._0_4_ = 0;
      in_stack_fffffffffffff138 = "util::LockResult::Success";
      in_stack_fffffffffffff130 = (__native_type *)local_410;
      in_stack_fffffffffffff128 = "util::LockDirectory(dirname, lockname)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
                (&(((__native_type *)local_410)->__data).__list,
                 &(((__native_type *)local_410)->__data).__owner,0x4b6,1,2,
                 &(((__native_type *)local_410)->__data).__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_468._4_4_ =
           util::LockDirectory((path *)CONCAT17(in_stack_fffffffffffff1af,in_stack_fffffffffffff1a8)
                               ,in_stack_fffffffffffff1a0,
                               SUB81((ulong)in_stack_fffffffffffff198 >> 0x38,0));
      local_468._0_4_ = 0;
      in_stack_fffffffffffff138 = "util::LockResult::Success";
      in_stack_fffffffffffff130 = (__native_type *)local_468;
      in_stack_fffffffffffff128 = "util::LockDirectory(dirname, lockname)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
                (&(((__native_type *)local_468)->__data).__list,
                 &(((__native_type *)local_468)->__data).__owner,0x4b9,1,2,
                 &(((__native_type *)local_468)->__data).__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    local_490 = local_46c;
    local_488 = &local_30;
    local_480 = local_80;
    std::thread::thread<util_tests::test_LockDirectory::test_method()::__0,,void>
              ((thread *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
               in_stack_fffffffffffff158);
    std::thread::join();
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_4e4[0].__data.__lock = 0;
      in_stack_fffffffffffff138 = "util::LockResult::Success";
      in_stack_fffffffffffff130 = local_4e4;
      in_stack_fffffffffffff128 = "threadresult";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
                (&local_4e4[0].__data.__spins,&local_4e4[0].__data.__count,0x4bf,1,2,local_46c);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_544[0]._4_8_ = ::write(local_84,&LockCommand,1);
      local_544[0].__data.__lock = 1;
      in_stack_fffffffffffff138 = "1";
      in_stack_fffffffffffff130 = local_544;
      in_stack_fffffffffffff128 = "write(fd[1], &LockCommand, 1)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                ((undefined1 *)((long)&local_544[0].__data.__list.__prev + 4),
                 &local_544[0].__data.__nusers,0x4c2,1,2,&local_544[0].__data.__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_5a4[0]._4_8_ = ::read(local_84,&local_1e9,1);
      local_5a4[0].__data.__lock = 1;
      in_stack_fffffffffffff138 = "1";
      in_stack_fffffffffffff130 = local_5a4;
      in_stack_fffffffffffff128 = "read(fd[1], &ch, 1)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                ((undefined1 *)((long)&local_5a4[0].__data.__list.__prev + 4),
                 &local_5a4[0].__data.__nusers,0x4c3,1,2,&local_5a4[0].__data.__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_5f9[0].__size[0] = '\x04';
      in_stack_fffffffffffff138 = "ResErrorLock";
      in_stack_fffffffffffff130 = local_5f9;
      in_stack_fffffffffffff128 = "ch";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,util_tests::__2>
                ((undefined1 *)((long)&local_5f9[0].__data.__kind + 1),
                 (undefined1 *)((long)&local_5f9[0].__data.__lock + 1),0x4c4,1,2,&local_1e9);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    ReleaseDirectoryLocks();
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_658[0]._4_4_ =
           util::LockDirectory((path *)CONCAT17(in_stack_fffffffffffff1af,in_stack_fffffffffffff1a8)
                               ,in_stack_fffffffffffff1a0,
                               SUB81((ulong)in_stack_fffffffffffff198 >> 0x38,0));
      local_658[0].__data.__lock = 0;
      in_stack_fffffffffffff138 = "util::LockResult::Success";
      in_stack_fffffffffffff130 = local_658;
      in_stack_fffffffffffff128 = "util::LockDirectory(dirname, lockname, true)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
                ((long)&local_658[0].__data + 0x18,(long)&local_658[0].__data + 8,0x4c9,1,2,
                 (long)&local_658[0].__data + 4);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_6b4[0]._4_8_ = ::write(local_84,&LockCommand,1);
      local_6b4[0].__data.__lock = 1;
      in_stack_fffffffffffff138 = "1";
      in_stack_fffffffffffff130 = local_6b4;
      in_stack_fffffffffffff128 = "write(fd[1], &LockCommand, 1)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                ((undefined1 *)((long)&local_6b4[0].__data.__list.__prev + 4),
                 &local_6b4[0].__data.__nusers,0x4cc,1,2,&local_6b4[0].__data.__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_714[0]._4_8_ = ::read(local_84,&local_1e9,1);
      local_714[0].__data.__lock = 1;
      in_stack_fffffffffffff138 = "1";
      in_stack_fffffffffffff130 = local_714;
      in_stack_fffffffffffff128 = "read(fd[1], &ch, 1)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                ((undefined1 *)((long)&local_714[0].__data.__list.__prev + 4),
                 &local_714[0].__data.__nusers,0x4cd,1,2,&local_714[0].__data.__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_769[0].__size[0] = '\x02';
      in_stack_fffffffffffff138 = "ResSuccess";
      in_stack_fffffffffffff130 = local_769;
      in_stack_fffffffffffff128 = "ch";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,util_tests::__2>
                ((undefined1 *)((long)&local_769[0].__data.__kind + 1),
                 (undefined1 *)((long)&local_769[0].__data.__lock + 1),0x4ce,1,2,&local_1e9);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_7c8._4_4_ =
           util::LockDirectory((path *)CONCAT17(in_stack_fffffffffffff1af,in_stack_fffffffffffff1a8)
                               ,in_stack_fffffffffffff1a0,
                               SUB81((ulong)in_stack_fffffffffffff198 >> 0x38,0));
      local_7c8._0_4_ = 2;
      in_stack_fffffffffffff138 = "util::LockResult::ErrorLock";
      in_stack_fffffffffffff130 = (__native_type *)local_7c8;
      in_stack_fffffffffffff128 = "util::LockDirectory(dirname, lockname, true)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
                (&(((__native_type *)local_7c8)->__data).__list,
                 &(((__native_type *)local_7c8)->__data).__owner,0x4d1,1,2,
                 &(((__native_type *)local_7c8)->__data).__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_824[0]._4_8_ = ::write(local_84,&UnlockCommand,1);
      local_824[0].__data.__lock = 1;
      in_stack_fffffffffffff138 = "1";
      in_stack_fffffffffffff130 = local_824;
      in_stack_fffffffffffff128 = "write(fd[1], &UnlockCommand, 1)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                ((undefined1 *)((long)&local_824[0].__data.__list.__prev + 4),
                 &local_824[0].__data.__nusers,0x4d4,1,2,&local_824[0].__data.__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_884[0]._4_8_ = ::read(local_84,&local_1e9,1);
      local_884[0].__data.__lock = 1;
      in_stack_fffffffffffff138 = "1";
      in_stack_fffffffffffff130 = local_884;
      in_stack_fffffffffffff128 = "read(fd[1], &ch, 1)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                ((undefined1 *)((long)&local_884[0].__data.__list.__prev + 4),
                 &local_884[0].__data.__nusers,0x4d5,1,2,&local_884[0].__data.__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_8d9[0].__size[0] = '\x05';
      in_stack_fffffffffffff138 = "ResUnlockSuccess";
      in_stack_fffffffffffff130 = local_8d9;
      in_stack_fffffffffffff128 = "ch";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,char,util_tests::__2>
                ((undefined1 *)((long)&local_8d9[0].__data.__kind + 1),
                 (undefined1 *)((long)&local_8d9[0].__data.__lock + 1),0x4d6,1,2,&local_1e9);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_938._4_4_ =
           util::LockDirectory((path *)CONCAT17(in_stack_fffffffffffff1af,in_stack_fffffffffffff1a8)
                               ,in_stack_fffffffffffff1a0,
                               SUB81((ulong)in_stack_fffffffffffff198 >> 0x38,0));
      local_938._0_4_ = 0;
      in_stack_fffffffffffff138 = "util::LockResult::Success";
      in_stack_fffffffffffff130 = (__native_type *)local_938;
      in_stack_fffffffffffff128 = "util::LockDirectory(dirname, lockname, true)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
                (&(((__native_type *)local_938)->__data).__list,
                 &(((__native_type *)local_938)->__data).__owner,0x4d9,1,2,
                 &(((__native_type *)local_938)->__data).__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_99c[0]._4_8_ = ::write(local_84,&LockCommand,1);
      local_99c[0].__data.__lock = 1;
      in_stack_fffffffffffff138 = "1";
      in_stack_fffffffffffff130 = local_99c;
      in_stack_fffffffffffff128 = "write(fd[1], &LockCommand, 1)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                ((undefined1 *)((long)&local_99c[0].__data.__list.__prev + 4),
                 &local_99c[0].__data.__nusers,0x4df,1,2,&local_99c[0].__data.__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_9fc[0]._4_8_ = ::write(local_84,&ExitCommand,1);
      local_9fc[0].__data.__lock = 1;
      in_stack_fffffffffffff138 = "1";
      in_stack_fffffffffffff130 = local_9fc;
      in_stack_fffffffffffff128 = "write(fd[1], &ExitCommand, 1)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
                ((undefined1 *)((long)&local_9fc[0].__data.__list.__prev + 4),
                 &local_9fc[0].__data.__nusers,0x4e3,1,2,&local_9fc[0].__data.__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      uVar2 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)uVar2);
    do {
      ppVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      plVar3 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_a54 = waitpid(local_134._0_4_,&local_93c,0);
      in_stack_fffffffffffff138 = "pid";
      in_stack_fffffffffffff130 = (__native_type *)local_134;
      in_stack_fffffffffffff128 = "waitpid(pid, &processstatus, 0)";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
                (local_a40,local_a50,0x4e4,1,2,&local_a54);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_aac[0].__data.__lock = 0;
      in_stack_fffffffffffff138 = "0";
      in_stack_fffffffffffff130 = local_aac;
      in_stack_fffffffffffff128 = "processstatus";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
                (&local_aac[0].__data.__spins,&local_aac[0].__data.__count,0x4e5,1,2,&local_93c);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)in_stack_fffffffffffff158,(const_string *)in_stack_fffffffffffff150);
      in_stack_fffffffffffff168 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      in_stack_fffffffffffff164 =
           util::LockDirectory((path *)CONCAT17(uVar2,in_stack_fffffffffffff1a8),ppVar4,
                               SUB81((ulong)plVar3 >> 0x38,0));
      local_b08._0_4_ = 0;
      in_stack_fffffffffffff138 = "util::LockResult::Success";
      in_stack_fffffffffffff130 = (__native_type *)local_b08;
      in_stack_fffffffffffff128 = "util::LockDirectory(dirname, lockname, true)";
      local_b08._4_4_ = in_stack_fffffffffffff164;
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,util::LockResult,util::LockResult>
                (&(((__native_type *)local_b08)->__data).__list,
                 &(((__native_type *)local_b08)->__data).__owner,0x4e6,1,2,
                 &(((__native_type *)local_b08)->__data).__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
      in_stack_fffffffffffff160 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff160);
    } while (bVar1);
    ::signal(0x11,__handler);
    do {
      ppVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffff128);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffff168,
                 (const_string *)CONCAT44(in_stack_fffffffffffff164,in_stack_fffffffffffff160),
                 (size_t)ppVar4,(const_string *)in_stack_fffffffffffff150);
      in_stack_fffffffffffff150 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)&in_stack_fffffffffffff130->__data,
                 (char (*) [1])in_stack_fffffffffffff128);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffff138,
                 in_stack_fffffffffffff130->__size,(unsigned_long)in_stack_fffffffffffff128);
      local_b60._4_4_ = close(local_84);
      local_b60._0_4_ = 0;
      in_stack_fffffffffffff138 = "0";
      in_stack_fffffffffffff130 = (__native_type *)local_b60;
      in_stack_fffffffffffff128 = "close(fd[1])";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
                (&(((__native_type *)local_b60)->__data).__list,
                 &(((__native_type *)local_b60)->__data).__owner,0x4ea,1,2,
                 &(((__native_type *)local_b60)->__data).__count);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffff128);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    ReleaseDirectoryLocks();
    std::filesystem::remove_all(&local_30);
    std::thread::~thread((thread *)in_stack_fffffffffffff128);
    fs::path::~path((path *)in_stack_fffffffffffff128);
    fs::path::~path((path *)in_stack_fffffffffffff128);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(test_LockDirectory)
{
    fs::path dirname = m_args.GetDataDirBase() / "lock_dir";
    const fs::path lockname = ".lock";
#ifndef WIN32
    // Revert SIGCHLD to default, otherwise boost.test will catch and fail on
    // it: there is BOOST_TEST_IGNORE_SIGCHLD but that only works when defined
    // at build-time of the boost library
    void (*old_handler)(int) = signal(SIGCHLD, SIG_DFL);

    // Fork another process for testing before creating the lock, so that we
    // won't fork while holding the lock (which might be undefined, and is not
    // relevant as test case as that is avoided with -daemonize).
    int fd[2];
    BOOST_CHECK_EQUAL(socketpair(AF_UNIX, SOCK_STREAM, 0, fd), 0);
    pid_t pid = fork();
    if (!pid) {
        BOOST_CHECK_EQUAL(close(fd[1]), 0); // Child: close parent end
        TestOtherProcess(dirname, lockname, fd[0]);
    }
    BOOST_CHECK_EQUAL(close(fd[0]), 0); // Parent: close child end

    char ch;
    // Lock on non-existent directory should fail
    BOOST_CHECK_EQUAL(write(fd[1], &LockCommand, 1), 1);
    BOOST_CHECK_EQUAL(read(fd[1], &ch, 1), 1);
    BOOST_CHECK_EQUAL(ch, ResErrorWrite);
#endif
    // Lock on non-existent directory should fail
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname), util::LockResult::ErrorWrite);

    fs::create_directories(dirname);

    // Probing lock on new directory should succeed
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname, true), util::LockResult::Success);

    // Persistent lock on new directory should succeed
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname), util::LockResult::Success);

    // Another lock on the directory from the same thread should succeed
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname), util::LockResult::Success);

    // Another lock on the directory from a different thread within the same process should succeed
    util::LockResult threadresult;
    std::thread thr([&] { threadresult = util::LockDirectory(dirname, lockname); });
    thr.join();
    BOOST_CHECK_EQUAL(threadresult, util::LockResult::Success);
#ifndef WIN32
    // Try to acquire lock in child process while we're holding it, this should fail.
    BOOST_CHECK_EQUAL(write(fd[1], &LockCommand, 1), 1);
    BOOST_CHECK_EQUAL(read(fd[1], &ch, 1), 1);
    BOOST_CHECK_EQUAL(ch, ResErrorLock);

    // Give up our lock
    ReleaseDirectoryLocks();
    // Probing lock from our side now should succeed, but not hold on to the lock.
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname, true), util::LockResult::Success);

    // Try to acquire the lock in the child process, this should be successful.
    BOOST_CHECK_EQUAL(write(fd[1], &LockCommand, 1), 1);
    BOOST_CHECK_EQUAL(read(fd[1], &ch, 1), 1);
    BOOST_CHECK_EQUAL(ch, ResSuccess);

    // When we try to probe the lock now, it should fail.
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname, true), util::LockResult::ErrorLock);

    // Unlock the lock in the child process
    BOOST_CHECK_EQUAL(write(fd[1], &UnlockCommand, 1), 1);
    BOOST_CHECK_EQUAL(read(fd[1], &ch, 1), 1);
    BOOST_CHECK_EQUAL(ch, ResUnlockSuccess);

    // When we try to probe the lock now, it should succeed.
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname, true), util::LockResult::Success);

    // Re-lock the lock in the child process, then wait for it to exit, check
    // successful return. After that, we check that exiting the process
    // has released the lock as we would expect by probing it.
    int processstatus;
    BOOST_CHECK_EQUAL(write(fd[1], &LockCommand, 1), 1);
    // The following line invokes the ~CNetCleanup dtor without
    // a paired SetupNetworking call. This is acceptable as long as
    // ~CNetCleanup is a no-op for non-Windows platforms.
    BOOST_CHECK_EQUAL(write(fd[1], &ExitCommand, 1), 1);
    BOOST_CHECK_EQUAL(waitpid(pid, &processstatus, 0), pid);
    BOOST_CHECK_EQUAL(processstatus, 0);
    BOOST_CHECK_EQUAL(util::LockDirectory(dirname, lockname, true), util::LockResult::Success);

    // Restore SIGCHLD
    signal(SIGCHLD, old_handler);
    BOOST_CHECK_EQUAL(close(fd[1]), 0); // Close our side of the socketpair
#endif
    // Clean up
    ReleaseDirectoryLocks();
    fs::remove_all(dirname);
}